

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,AddressMode address_mode,
          MemoryAccess access)

{
  Pipeline local_2f8;
  Pipeline local_2a0;
  Pipeline local_248;
  Pipeline local_1f0;
  Pipeline local_198;
  Pipeline local_140;
  Pipeline local_e8;
  Pipeline local_80;
  undefined1 local_21;
  MemoryAccess local_20;
  AddressMode local_1c;
  MemoryAccess access_local;
  AddressMode address_mode_local;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_21 = 0;
  local_20 = access;
  local_1c = address_mode;
  _access_local = this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  Pipeline::Pipeline(__return_storage_ptr__);
  switch(local_1c) {
  case Zeropage:
    create_zeropage_addressing_steps(&local_80,this,local_20);
    Pipeline::append(__return_storage_ptr__,&local_80);
    Pipeline::~Pipeline(&local_80);
    break;
  case ZeropageX:
    create_zeropage_indexed_addressing_steps(&local_e8,this,&this->registers_->x,local_20);
    Pipeline::append(__return_storage_ptr__,&local_e8);
    Pipeline::~Pipeline(&local_e8);
    break;
  case ZeropageY:
    create_zeropage_indexed_addressing_steps(&local_140,this,&this->registers_->y,local_20);
    Pipeline::append(__return_storage_ptr__,&local_140);
    Pipeline::~Pipeline(&local_140);
    break;
  default:
    break;
  case Absolute:
    create_absolute_addressing_steps(&local_198,this,local_20);
    Pipeline::append(__return_storage_ptr__,&local_198);
    Pipeline::~Pipeline(&local_198);
    break;
  case AbsoluteX:
    create_absolute_indexed_addressing_steps(&local_1f0,this,&this->registers_->x,local_20);
    Pipeline::append(__return_storage_ptr__,&local_1f0);
    Pipeline::~Pipeline(&local_1f0);
    break;
  case AbsoluteY:
    create_absolute_indexed_addressing_steps(&local_248,this,&this->registers_->y,local_20);
    Pipeline::append(__return_storage_ptr__,&local_248);
    Pipeline::~Pipeline(&local_248);
    break;
  case IndexedIndirect:
    create_indexed_indirect_addressing_steps(&local_2a0,this,local_20);
    Pipeline::append(__return_storage_ptr__,&local_2a0);
    Pipeline::~Pipeline(&local_2a0);
    break;
  case IndirectIndexed:
    create_indirect_indexed_addressing_steps(&local_2f8,this,local_20);
    Pipeline::append(__return_storage_ptr__,&local_2f8);
    Pipeline::~Pipeline(&local_2f8);
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_addressing_steps(AddressMode address_mode,
        const MemoryAccess access) {
    Pipeline result;

    switch (address_mode) {
    case AddressMode::Zeropage:
        result.append(create_zeropage_addressing_steps(access));
        break;
    case AddressMode::ZeropageX:
        result.append(create_zeropage_indexed_addressing_steps(
                &registers_->x, access));
        break;
    case AddressMode::ZeropageY:
        result.append(create_zeropage_indexed_addressing_steps(
                &registers_->y, access));
        break;
    case AddressMode::Absolute:
        result.append(create_absolute_addressing_steps(access));
        break;
    case AddressMode::AbsoluteX:
        result.append(create_absolute_indexed_addressing_steps(
                &registers_->x, access));
        break;
    case AddressMode::AbsoluteY:
        result.append(create_absolute_indexed_addressing_steps(
                &registers_->y, access));
        break;
    case AddressMode::IndexedIndirect:
        result.append(create_indexed_indirect_addressing_steps(access));
        break;
    case AddressMode::IndirectIndexed:
        result.append(create_indirect_indexed_addressing_steps(access));
        break;
    default:
        break;
    }

    return result;
}